

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O0

MPP_RET vp8e_write_entropy_tables(void *hal)

{
  long lVar1;
  RK_U32 *buf;
  int local_40;
  int local_3c;
  RK_S32 l;
  RK_S32 k;
  RK_S32 j;
  RK_S32 i;
  RK_U8 *table;
  Vp8eHalEntropy *entropy;
  Vp8eVpuBuf *buffers;
  HalVp8eCtx *ctx;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x60);
  _j = (undefined1 *)
       mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x30),"vp8e_write_entropy_tables");
  memset(_j,0,0x38);
  *_j = (char)*(undefined4 *)((long)hal + 0x524);
  _j[1] = (char)*(undefined4 *)((long)hal + 0x528);
  _j[2] = (char)*(undefined4 *)((long)hal + 0x52c);
  _j[3] = (char)*(undefined4 *)((long)hal + 0x530);
  _j[4] = (char)*(undefined4 *)((long)hal + 0x3630);
  _j[5] = (char)*(undefined4 *)((long)hal + 0x3634);
  _j[6] = (char)*(undefined4 *)((long)hal + 0x3638);
  _j[8] = (char)*(undefined4 *)((long)hal + 0x544);
  _j[9] = (char)*(undefined4 *)((long)hal + 0x548);
  _j[10] = (char)*(undefined4 *)((long)hal + 0x54c);
  _j[0xb] = (char)*(undefined4 *)((long)hal + 0x550);
  _j[0xc] = (char)*(undefined4 *)((long)hal + 0x560);
  _j[0xd] = (char)*(undefined4 *)((long)hal + 0x564);
  _j[0xe] = (char)*(undefined4 *)((long)hal + 0x568);
  _j[0x10] = (char)*(undefined4 *)((long)hal + 0x34fc);
  _j[0x11] = (char)*(undefined4 *)((long)hal + 0x34b0);
  _j[0x12] = (char)*(undefined4 *)((long)hal + 0x3500);
  _j[0x13] = (char)*(undefined4 *)((long)hal + 0x34b4);
  _j[0x14] = (char)*(undefined4 *)((long)hal + 0x3540);
  _j[0x15] = (char)*(undefined4 *)((long)hal + 0x3544);
  _j[0x16] = (char)*(undefined4 *)((long)hal + 0x34f4);
  _j[0x17] = (char)*(undefined4 *)((long)hal + 0x34f8);
  for (k = 0; k < 8; k = k + 1) {
    _j[k + 0x18] = (char)*(undefined4 *)((long)hal + (long)(k + 9) * 4 + 0x34fc);
  }
  for (k = 0; k < 8; k = k + 1) {
    _j[k + 0x20] = (char)*(undefined4 *)((long)hal + (long)(k + 9) * 4 + 0x34b0);
  }
  for (k = 0; k < 7; k = k + 1) {
    _j[k + 0x28] = (char)*(undefined4 *)((long)hal + (long)(k + 2) * 4 + 0x34fc);
  }
  for (k = 0; k < 7; k = k + 1) {
    _j[k + 0x30] = (char)*(undefined4 *)((long)hal + (long)(k + 2) * 4 + 0x34b0);
  }
  if (*(int *)((long)hal + 0x362c) != 0) {
    _j = _j + 0x38;
    for (k = 0; k < 4; k = k + 1) {
      for (l = 0; l < 8; l = l + 1) {
        for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
          for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
            *_j = (char)*(undefined4 *)
                         ((long)hal +
                         (long)local_40 * 4 +
                         (long)local_3c * 0x2c + (long)l * 0x84 + (long)k * 0x420 + 0x13a0);
            _j = _j + 1;
          }
          *_j = 0;
          _j = _j + 1;
        }
      }
    }
    for (k = 0; k < 4; k = k + 1) {
      for (l = 0; l < 8; l = l + 1) {
        for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
          for (local_40 = 4; local_40 < 0xb; local_40 = local_40 + 1) {
            *_j = (char)*(undefined4 *)
                         ((long)hal +
                         (long)local_40 * 4 +
                         (long)local_3c * 0x2c + (long)l * 0x84 + (long)k * 0x420 + 0x13a0);
            _j = _j + 1;
          }
          *_j = (char)((undefined4 *)((long)hal + 0x524))
                      [(long)k * 0x108 + (long)l * 0x21 + (long)local_3c * 0xb + 0x3a2];
          _j = _j + 1;
        }
      }
    }
  }
  buf = (RK_U32 *)
        mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x30),"vp8e_write_entropy_tables");
  if (*(int *)((long)hal + 0x362c) == 0) {
    vp8e_swap_endian(buf,0x38);
  }
  else {
    vp8e_swap_endian(buf,0x4b8);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar1 + 0x30),0,"vp8e_write_entropy_tables");
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_write_entropy_tables(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
    Vp8eHalEntropy *entropy = &ctx->entropy;

    RK_U8 *table = (RK_U8 *)mpp_buffer_get_ptr(buffers->hw_cabac_table_buf);
    /* Write probability tables to ASIC linear memory, reg + mem */
    memset(table, 0, 56);  // use 56 bytes
    table[0] = entropy->skip_false_prob;
    table[1] = entropy->intra_prob;
    table[2] = entropy->last_prob;
    table[3] = entropy->gf_prob;
    table[4] = entropy->segment_prob[0];
    table[5] = entropy->segment_prob[1];
    table[6] = entropy->segment_prob[2];

    table[8]  = entropy->y_mode_prob[0];
    table[9]  = entropy->y_mode_prob[1];
    table[10] = entropy->y_mode_prob[2];
    table[11] = entropy->y_mode_prob[3];
    table[12] = entropy->uv_mode_prob[0];
    table[13] = entropy->uv_mode_prob[1];
    table[14] = entropy->uv_mode_prob[2];

    /* MV probabilities x+y: short, sign, size 8-9 */
    table[16] = entropy->mv_prob[1][0];
    table[17] = entropy->mv_prob[0][0];
    table[18] = entropy->mv_prob[1][1];
    table[19] = entropy->mv_prob[0][1];
    table[20] = entropy->mv_prob[1][17];
    table[21] = entropy->mv_prob[1][18];
    table[22] = entropy->mv_prob[0][17];
    table[23] = entropy->mv_prob[0][18];
    {
        RK_S32 i, j, k, l;
        /* MV X size */
        for (i = 0; i < 8; i++)
            table[24 + i] = entropy->mv_prob[1][9 + i];

        /* MV Y size */
        for (i = 0; i < 8; i++)
            table[32 + i] = entropy->mv_prob[0][9 + i];

        /* MV X short tree */
        for (i = 0; i < 7; i++)
            table[40 + i] = entropy->mv_prob[1][2 + i];

        /* MV Y short tree */
        for (i = 0; i < 7; i++)
            table[48 + i] = entropy->mv_prob[0][2 + i];

        /* Update the ASIC table when needed. */
        if (entropy->update_coeff_prob_flag) {
            table += 56;
            /* DCT coeff probabilities 0-2, two fields per line. */
            for (i = 0; i < 4; i++)
                for (j = 0; j < 8; j++)
                    for (k = 0; k < 3; k++) {
                        for (l = 0; l < 3; l++) {
                            *table++ = entropy->coeff_prob[i][j][k][l];
                        }
                        *table++ = 0;
                    }

            /* ASIC second probability table in ext mem.
             * DCT coeff probabilities 4 5 6 7 8 9 10 3 on each line.
             * coeff 3 was moved from first table to second so it is last. */
            for (i = 0; i < 4; i++)
                for (j = 0; j < 8; j++)
                    for (k = 0; k < 3; k++) {
                        for (l = 4; l < 11; l++) {
                            *table++ = entropy->coeff_prob[i][j][k][l];
                        }
                        *table++ = entropy->coeff_prob[i][j][k][3];
                    }
        }
    }
    table = mpp_buffer_get_ptr(buffers->hw_cabac_table_buf);
    if (entropy->update_coeff_prob_flag)
        vp8e_swap_endian((RK_U32 *) table, 56 + 8 * 48 + 8 * 96);
    else
        vp8e_swap_endian((RK_U32 *) table, 56);

    mpp_buffer_sync_end(buffers->hw_cabac_table_buf);

    return MPP_OK;
}